

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudotopoorder.cpp
# Opt level: O0

void __thiscall PseudoTopoOrder::apply(PseudoTopoOrder *this,Path *P,int u,int v)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  bool bVar1;
  node_t nVar2;
  reference pNVar3;
  reference piVar4;
  reference pvVar5;
  int in_ECX;
  int in_EDX;
  Path *in_RSI;
  PseudoTopoOrder *in_RDI;
  int p;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int i;
  int index;
  NeighborNode x;
  const_iterator __end1;
  const_iterator __begin1;
  deque<NeighborNode,_std::allocator<NeighborNode>_> *__range1;
  vector<int,_std::allocator<int>_> nodesofPbetweenuandv;
  vector<int,_std::allocator<int>_> indexesofPbetweenuandv;
  _Self *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  value_type in_stack_fffffffffffffed4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffed8;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d8;
  undefined1 *local_d0;
  int local_c4;
  int *local_c0;
  int *local_b8;
  node_t local_b0;
  int local_ac;
  NeighborNode local_a8 [5];
  _Deque_iterator<NeighborNode,_const_NeighborNode_&,_const_NeighborNode_*> local_80;
  deque<NeighborNode,_std::allocator<NeighborNode>_> *local_50;
  vector<int,_std::allocator<int>_> local_48;
  undefined1 local_30 [24];
  int local_18;
  int local_14;
  Path *local_10;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15074f);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15075c);
  local_50 = Path::get_path(local_10);
  std::deque<NeighborNode,_std::allocator<NeighborNode>_>::begin
            ((deque<NeighborNode,_std::allocator<NeighborNode>_> *)in_stack_fffffffffffffec8);
  std::deque<NeighborNode,_std::allocator<NeighborNode>_>::end
            ((deque<NeighborNode,_std::allocator<NeighborNode>_> *)in_stack_fffffffffffffec8);
  while( true ) {
    bVar1 = std::operator!=((_Self *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            in_stack_fffffffffffffec8);
    if (!bVar1) break;
    pNVar3 = std::_Deque_iterator<NeighborNode,_const_NeighborNode_&,_const_NeighborNode_*>::
             operator*(&local_80);
    local_a8[0] = *pNVar3;
    nVar2 = NeighborNode::operator_cast_to_int(local_a8);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->pto_inverse,(long)nVar2);
    local_ac = *pvVar5;
    if ((local_14 <= local_ac) && (local_ac < local_18)) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8._M_current);
      local_b0 = NeighborNode::operator_cast_to_int(local_a8);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (value_type *)in_stack_fffffffffffffec8);
    }
    std::_Deque_iterator<NeighborNode,_const_NeighborNode_&,_const_NeighborNode_*>::operator++
              ((_Deque_iterator<NeighborNode,_const_NeighborNode_&,_const_NeighborNode_*> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  }
  local_b8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8);
  local_c0 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8);
  __first._M_current._4_4_ = in_stack_fffffffffffffee4;
  __first._M_current._0_4_ = in_stack_fffffffffffffee0;
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (__first,in_stack_fffffffffffffed8);
  local_c4 = 0;
  local_d0 = local_30;
  local_d8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffec8);
    if (!bVar1) break;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_d8);
    in_stack_fffffffffffffee4 = *piVar4;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_c4);
    in_stack_fffffffffffffed4 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->pto,(long)in_stack_fffffffffffffee4);
    *pvVar5 = in_stack_fffffffffffffed4;
    this_00 = &in_RDI->pto_inverse;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RDI->pto,(long)in_stack_fffffffffffffee4);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar5);
    *pvVar5 = in_stack_fffffffffffffee4;
    local_c4 = local_c4 + 1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_d8);
  }
  AnnounceModification(in_RDI,local_14);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  return;
}

Assistant:

void PseudoTopoOrder::apply(const Path& P, int u, int v)
{
// 	cout << "Before applying Q, we get: " << Value() << endl;

	std::vector<int> indexesofPbetweenuandv;
	std::vector<int> nodesofPbetweenuandv;

	for (auto x : P.get_path())
	{
		int index = pto_inverse[x];

		if (u <= index && index < v)
		{
			indexesofPbetweenuandv.push_back(index);
			nodesofPbetweenuandv.push_back(x);
// 			cout << "found " << x << " at " << index << endl;
		}
	}

	sort(indexesofPbetweenuandv.begin(), indexesofPbetweenuandv.end());
	int i = 0;

	for (auto p : indexesofPbetweenuandv)
	{
		pto[p] = nodesofPbetweenuandv[i];
		pto_inverse[pto[p]] = p;
		++i;
	}

// 	AnnounceModification(indexesofPbetweenuandv[0]);
	AnnounceModification(u);
// 	cout << "After applying Q, we get: " << Value() << endl;
}